

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ScopedMessage::~ScopedMessage(ScopedMessage *this)

{
  pointer pcVar1;
  int iVar2;
  IResultCapture *pIVar3;
  
  iVar2 = std::uncaught_exceptions();
  if ((iVar2 < 1) && (this->m_moved == false)) {
    pIVar3 = getResultCapture();
    (*pIVar3->_vptr_IResultCapture[7])(pIVar3,this);
  }
  pcVar1 = (this->m_info).message._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_info).message.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

ScopedMessage::~ScopedMessage() {
        if ( !uncaught_exceptions() && !m_moved ){
            getResultCapture().popScopedMessage(m_info);
        }
    }